

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

void lyd_free(lyd_node *node)

{
  lyd_node *plVar1;
  ushort uVar2;
  lys_node *plVar3;
  lyd_node *node_00;
  ly_ctx *ctx;
  
  if (node == (lyd_node *)0x0) {
    return;
  }
  plVar3 = node->schema;
  if ((plVar3->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
    node_00 = node->child;
    while (node_00 != (lyd_node *)0x0) {
      plVar1 = node_00->next;
      lyd_free(node_00);
      node_00 = plVar1;
    }
    goto switchD_0015cb8e_caseD_6;
  }
  if ((plVar3->nodetype & LYS_ANYDATA) == LYS_UNKNOWN) {
    uVar2 = *(ushort *)&node[1].validity & 0x3f;
    if (uVar2 == 0xb) {
      lydict_remove(plVar3->module->ctx,(char *)node[1].schema);
    }
    else if ((uVar2 == 2) && (node[1].schema != (lys_node *)0x0)) {
      free(node[1].schema);
    }
    plVar3 = (lys_node *)node->child;
    ctx = node->schema->module->ctx;
LAB_0015cbfd:
    lydict_remove(ctx,(char *)plVar3);
  }
  else {
    switch(*(undefined4 *)&node->child) {
    case 0:
    case 2:
    case 4:
      ctx = plVar3->module->ctx;
      plVar3 = node[1].schema;
      goto LAB_0015cbfd;
    case 1:
    case 3:
    case 5:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                    ,0x1322,"void lyd_free(struct lyd_node *)");
    case 8:
      lyxml_free_withsiblings(plVar3->module->ctx,(lyxml_elem *)node[1].schema);
      break;
    case 0x10:
      lyd_free_withsiblings((lyd_node *)node[1].schema);
    }
  }
switchD_0015cb8e_caseD_6:
  lyd_unlink_internal(node,1);
  lyd_free_attr(node->schema->module->ctx,node,node->attr,1);
  free(node);
  return;
}

Assistant:

API void
lyd_free(struct lyd_node *node)
{
    struct lyd_node *next, *iter;

    if (!node) {
        return;
    }

    if (!(node->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA))) {
        /* free children */
        LY_TREE_FOR_SAFE(node->child, next, iter) {
            lyd_free(iter);
        }
    } else if (node->schema->nodetype & LYS_ANYDATA) {
        switch (((struct lyd_node_anydata *)node)->value_type) {
        case LYD_ANYDATA_CONSTSTRING:
        case LYD_ANYDATA_SXML:
        case LYD_ANYDATA_JSON:
            lydict_remove(node->schema->module->ctx, ((struct lyd_node_anydata *)node)->value.str);
            break;
        case LYD_ANYDATA_DATATREE:
            lyd_free_withsiblings(((struct lyd_node_anydata *)node)->value.tree);
            break;
        case LYD_ANYDATA_XML:
            lyxml_free_withsiblings(node->schema->module->ctx, ((struct lyd_node_anydata *)node)->value.xml);
            break;
        case LYD_ANYDATA_STRING:
        case LYD_ANYDATA_SXMLD:
        case LYD_ANYDATA_JSOND:
            /* dynamic strings are used only as input parameters */
            assert(0);
            break;
        }
    } else { /* LYS_LEAF | LYS_LEAFLIST */
        /* free value */
        switch (((struct lyd_node_leaf_list *)node)->value_type & LY_DATA_TYPE_MASK) {
        case LY_TYPE_BITS:
            if (((struct lyd_node_leaf_list *)node)->value.bit) {
                free(((struct lyd_node_leaf_list *)node)->value.bit);
            }
            break;
        case LY_TYPE_UNION:
            /* unresolved union leaf */
            lydict_remove(node->schema->module->ctx, ((struct lyd_node_leaf_list *)node)->value.string);
            break;
        default:
            break;
        }

        lydict_remove(node->schema->module->ctx, ((struct lyd_node_leaf_list *)node)->value_str);
    }

    lyd_unlink(node);
    lyd_free_attr(node->schema->module->ctx, node, node->attr, 1);
    free(node);
}